

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract.cpp
# Opt level: O2

void __thiscall
ContractFrame::CheckPrecondition(ContractFrame *this,bool expr,char *stringifed_expr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined7 in_register_00000031;
  undefined1 local_c0 [8];
  string panic_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((int)CONCAT71(in_register_00000031,expr) != 0) {
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&panic_msg.field_2 + 8);
  s_abi_cxx11_(__return_storage_ptr__,"precondition failed in function \'",0x21);
  std::operator+(&local_60,__return_storage_ptr__,this->function_name);
  s_abi_cxx11_(&local_40,"\': ",3);
  std::operator+(&local_80,&local_60,&local_40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 &local_80,stringifed_expr);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)(panic_msg.field_2._M_local_buf + 8));
  PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/contract.cpp"
            ,0x27,"CheckPrecondition",(char *)local_c0);
}

Assistant:

void ContractFrame::CheckPrecondition(bool expr, const char *stringifed_expr) {
  if (!expr) {
    std::string panic_msg = "precondition failed in function '"s +
                            function_name + "': "s + stringifed_expr;
    PANIC(panic_msg.c_str());
  }
}